

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiline_string.cpp
# Opt level: O3

void __thiscall
MultilineString_Simple_Test::~MultilineString_Simple_Test(MultilineString_Simple_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(MultilineString, Simple) {
    test_parsing("\"\"\"\"\"\"", "");
    test_parsing("\"\"\" \" \"\"\"", " \" ");
    test_parsing("\"\"\" \"\" \"\"\"", " \"\" ");
    test_parsing("\"\"\"\" \"\"\"", "\" ");
    test_parsing("\"\"\"\"\" \"\"\"", "\"\" ");
    test_parsing("\"\"\"test\"\"\"", "test");
    test_parsing("\"\"\"test\ntest\"\"\"", "test\ntest");
}